

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.hpp
# Opt level: O1

void Model::dHdx(double *ret,double *x,double *u,double *p,double *lmd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = *x;
  dVar2 = x[2];
  dVar3 = *p;
  dVar4 = lmd[3];
  dVar5 = cos(dVar1 - x[1]);
  dVar6 = sin(*x - x[1]);
  dVar9 = *u;
  dVar7 = sin(*x - x[1]);
  *ret = (dVar7 * -5.65635 * x[2] + dVar5 * dVar2 * 0.905016 * dVar2 + dVar6 * 14.1183 * dVar9) *
         dVar4 + (dVar1 - dVar3);
  dVar1 = x[1];
  dVar2 = p[1];
  dVar3 = lmd[3];
  dVar4 = x[2];
  dVar5 = cos(*x - dVar1);
  dVar6 = cos(x[1]);
  dVar7 = sin(*x - x[1]);
  dVar9 = *u;
  dVar8 = sin(*x - x[1]);
  ret[1] = (dVar8 * 5.65635 * x[2] +
           dVar7 * -14.1183 * dVar9 + dVar5 * dVar4 * -0.905016 * dVar4 + dVar6 * 39.1111) * dVar3 +
           (dVar1 - dVar2);
  dVar1 = x[2];
  dVar2 = *lmd;
  dVar3 = lmd[2];
  dVar4 = lmd[3];
  dVar9 = sin(*x - x[1]);
  dVar5 = cos(*x - x[1]);
  ret[2] = (dVar9 * dVar1 * 1.810032 + dVar5 * 5.65635 + 0.0407448) * dVar4 +
           dVar3 * -6.25 + dVar1 * 0.0 + dVar2;
  ret[3] = (x[3] * 0.0 + lmd[1]) - lmd[3] * 0.0407448;
  return;
}

Assistant:

static void dHdx(double* ret, const double* x, const double* u, const double* p, const double* lmd) {
    ret[0] = (x[0] - p[0]) * q0 + lmd[3] * (A32 * x[2] * x[2] * cos(x[0] - x[1]) + A32b * sin(x[0] - x[1]) * u[0] - A32a * sin(x[0] - x[1]) * x[2]);
    ret[1] = (x[1] - p[1]) * q1 + lmd[3] * (-A32 * x[2] * x[2] * cos(x[0] - x[1]) + A52 * cos(x[1]) - A32b * sin(x[0] - x[1]) * u[0] + A32a * sin(x[0] - x[1]) * x[2]);
    ret[2] = x[2] * q2 + lmd[0] - lmd[2] * As + lmd[3] * (0.2e1 * A32 * x[2] * sin(x[0] - x[1]) + A32a * cos(x[0] - x[1]) + C22);
    ret[3] = x[3] * q3 + lmd[1] - lmd[3] * C22;
  }